

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O0

int u8_charnum(char *s,int offset)

{
  char *pcVar1;
  bool bVar2;
  char *end;
  char *string;
  int charnum;
  int offset_local;
  char *s_local;
  
  string._0_4_ = 0;
  end = s;
  while( true ) {
    bVar2 = false;
    if (end < s + offset) {
      bVar2 = *end != '\0';
    }
    if (!bVar2) break;
    pcVar1 = end + 1;
    if ((((((int)*end & 0x80U) != 0) && (((int)*pcVar1 & 0xc0U) == 0x80)) &&
        (pcVar1 = end + 2, ((int)end[2] & 0xc0U) == 0x80)) &&
       (pcVar1 = end + 3, ((int)end[3] & 0xc0U) == 0x80)) {
      pcVar1 = end + 4;
    }
    end = pcVar1;
    string._0_4_ = (int)string + 1;
  }
  return (int)string;
}

Assistant:

int u8_charnum(const char *s, int offset)
{
    int charnum = 0;
    const char *string = s;
    const char *const end = string + offset;

    while (string < end && *string != '\0') {
        if (*string++ & 0x80) {
            if (!isutf(*string)) {
                ++string;
                if (!isutf(*string)) {
                    ++string;
                    if (!isutf(*string)) {
                        ++string;
                    }
                }
            }
        }
        ++charnum;
    }
    return charnum;
}